

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDValidator.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DTDValidator::checkContent
          (DTDValidator *this,XMLElementDecl *elemDecl,QName **children,XMLSize_t childCount,
          XMLSize_t *indexFailingChild)

{
  byte bVar1;
  ModelTypes MVar2;
  int iVar3;
  uint uVar4;
  RuntimeException *pRVar5;
  XMLScanner *pXVar6;
  MemoryManager *pMVar7;
  undefined4 extraout_var;
  XMLContentModel *elemCM;
  ModelTypes modelType;
  XMLSize_t *indexFailingChild_local;
  XMLSize_t childCount_local;
  QName **children_local;
  XMLElementDecl *elemDecl_local;
  DTDValidator *this_local;
  
  if (elemDecl == (XMLElementDecl *)0x0) {
    pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x30);
    pXVar6 = XMLValidator::getScanner(&this->super_XMLValidator);
    pMVar7 = XMLScanner::getMemoryManager(pXVar6);
    RuntimeException::RuntimeException
              (pRVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDValidator.cpp"
               ,0x40,Val_InvalidElemId,pMVar7);
    __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  MVar2 = DTDElementDecl::getModelType((DTDElementDecl *)elemDecl);
  if (MVar2 == Empty) {
    if (childCount != 0) {
      *indexFailingChild = 0;
      return false;
    }
  }
  else if (MVar2 != Any) {
    if ((MVar2 != Mixed_Simple) && (MVar2 != Children)) {
      pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x30);
      pXVar6 = XMLValidator::getScanner(&this->super_XMLValidator);
      pMVar7 = XMLScanner::getMemoryManager(pXVar6);
      RuntimeException::RuntimeException
                (pRVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDValidator.cpp"
                 ,99,CM_UnknownCMType,pMVar7);
      __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    iVar3 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[0xb])();
    pXVar6 = XMLValidator::getScanner(&this->super_XMLValidator);
    uVar4 = XMLScanner::getEmptyNamespaceId(pXVar6);
    pXVar6 = XMLValidator::getScanner(&this->super_XMLValidator);
    pMVar7 = XMLScanner::getMemoryManager(pXVar6);
    bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar3),children,childCount,uVar4,
                       indexFailingChild,pMVar7);
    return (bool)(bVar1 & 1);
  }
  return true;
}

Assistant:

bool DTDValidator::checkContent(XMLElementDecl* const elemDecl
                              , QName** const         children
                              , XMLSize_t             childCount
                              , XMLSize_t*         indexFailingChild)
{
    //
    //  Look up the element id in our element decl pool. This will get us
    //  the element decl in our own way of looking at them.
    //
    if (!elemDecl)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Val_InvalidElemId, getScanner()->getMemoryManager());

    //
    //  Get the content spec type of this element. This will tell us what
    //  to do to validate it.
    //
    const DTDElementDecl::ModelTypes modelType = ((DTDElementDecl*) elemDecl)->getModelType();

    if (modelType == DTDElementDecl::Empty)
    {
        //
        //  We can do this one here. It cannot have any children. If it does
        //  we return 0 as the index of the first bad child.
        //
        if (childCount)
        {
            *indexFailingChild=0;
            return false;
        }
    }
     else if (modelType == DTDElementDecl::Any)
    {
        // We pass no judgement on this one, anything goes
    }
     else if ((modelType == DTDElementDecl::Mixed_Simple)
          ||  (modelType == DTDElementDecl::Children))
    {
        // Get the element's content model or fault it in
        const XMLContentModel* elemCM = elemDecl->getContentModel();

        // Ask it to validate and return its return
        return elemCM->validateContent(children, childCount, getScanner()->getEmptyNamespaceId(), indexFailingChild, getScanner()->getMemoryManager());
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMType, getScanner()->getMemoryManager());
    }

    // Went ok, so return success
    return true;
}